

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

bool __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
::InnerMap::TableEntryIsTooLong(InnerMap *this,size_type b)

{
  void *pvVar1;
  LogMessage *other;
  ulong uVar2;
  LogFinisher local_49;
  LogMessage local_48;
  
  pvVar1 = this->table_[b];
  uVar2 = 0;
  do {
    uVar2 = uVar2 + 1;
    pvVar1 = *(void **)((long)pvVar1 + 0x40);
  } while (pvVar1 != (void *)0x0);
  if (8 < uVar2) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x3fe);
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: (count) <= (kMaxLength): ");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return 7 < uVar2;
}

Assistant:

bool TableEntryIsTooLong(size_type b) {
      const size_type kMaxLength = 8;
      size_type count = 0;
      Node* node = static_cast<Node*>(table_[b]);
      do {
        ++count;
        node = node->next;
      } while (node != nullptr);
      // Invariant: no linked list ever is more than kMaxLength in length.
      GOOGLE_DCHECK_LE(count, kMaxLength);
      return count >= kMaxLength;
    }